

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Identifier.hpp
# Opt level: O3

void __thiscall Centaurus::Identifier::parse(Identifier *this,Stream *stream)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  int iVar3;
  StreamException *__return_storage_ptr__;
  wchar_t *pwVar4;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pwVar1 = (stream->m_cur)._M_current;
  wVar2 = Stream::get(stream);
  if ((wVar2 != L'_') && (iVar3 = iswalpha(wVar2), iVar3 == 0)) {
    __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
    Stream::unexpected(__return_storage_ptr__,stream,wVar2);
    __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,StreamException::~StreamException)
    ;
  }
  pwVar4 = (stream->m_cur)._M_current;
  if (pwVar4 != (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length)
  goto LAB_001339ba;
  wVar2 = L'\0';
  while ((wVar2 == L'_' || (iVar3 = iswalnum(wVar2), iVar3 != 0))) {
    Stream::get(stream);
    pwVar4 = (stream->m_cur)._M_current;
    wVar2 = L'\0';
    if (pwVar4 != (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
LAB_001339ba:
      wVar2 = *pwVar4;
    }
  }
  local_48[0] = local_38;
  std::__cxx11::wstring::
  _M_construct<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>
            ((wstring *)local_48,pwVar1,(stream->m_cur)._M_current);
  std::__cxx11::wstring::operator=((wstring *)&this->m_id,(wstring *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

void parse(Stream& stream)
    {
        Stream::Sentry sentry = stream.sentry();

        wchar_t ch = stream.get();
        if (!is_symbol_leader(ch))
        {
            throw stream.unexpected(ch);
        }

        ch = stream.peek();
        for (; is_symbol_char(ch); ch = stream.peek())
        {
            stream.discard();
        }

        m_id = stream.cut(sentry);
    }